

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNotFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  int code;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      code = 0x17;
    }
    else {
      pxVar1 = ctxt->value;
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        if (pxVar1->type == XPATH_BOOLEAN) {
LAB_001c02d0:
          pxVar1->boolval = (uint)(pxVar1->boolval == 0);
          return;
        }
        xmlXPathBooleanFunction(ctxt,1);
        pxVar1 = ctxt->value;
        if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_BOOLEAN))
        goto LAB_001c02d0;
      }
      code = 0xb;
    }
  }
  else {
    code = 0xc;
  }
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathNotFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(1);
    CAST_TO_BOOLEAN;
    CHECK_TYPE(XPATH_BOOLEAN);
    ctxt->value->boolval = ! ctxt->value->boolval;
}